

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Transmitter_PDU::~Transmitter_PDU(Transmitter_PDU *this)

{
  Transmitter_PDU *this_local;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_0032e258;
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vModulationParams);
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vAntennaPattern);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_vAntennaPattern);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_vModulationParams);
  DATA_TYPE::CryptoSystem::~CryptoSystem(&this->m_CryptoSystem);
  DATA_TYPE::ModulationType::~ModulationType(&this->m_ModulationType);
  DATA_TYPE::AntennaLocation::~AntennaLocation(&this->m_AntennaLocation);
  DATA_TYPE::RadioEntityType::~RadioEntityType(&this->m_RadioEntityType);
  Radio_Communications_Header::~Radio_Communications_Header
            (&this->super_Radio_Communications_Header);
  return;
}

Assistant:

Transmitter_PDU::~Transmitter_PDU()
{
    m_vModulationParams.clear();
    m_vAntennaPattern.clear();
}